

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::V5::ControlPacketSerializableImpl::copyInto
          (ControlPacketSerializableImpl *this,uint8 *buffer)

{
  uint32 uVar1;
  int iVar2;
  uint uVar3;
  uint32 o;
  uint8 *buffer_local;
  ControlPacketSerializableImpl *this_local;
  
  *buffer = this->header->typeAndFlags;
  uVar1 = Common::VBInt::copyInto(&this->remLength,buffer + 1);
  iVar2 = (*(this->fixedVariableHeader->super_Serializable)._vptr_Serializable[1])
                    (this->fixedVariableHeader,buffer + (uVar1 + 1));
  uVar3 = iVar2 + uVar1 + 1;
  iVar2 = (*(this->props->super_Serializable)._vptr_Serializable[1])(this->props,buffer + uVar3);
  uVar3 = iVar2 + uVar3;
  iVar2 = (*(this->payload->super_EmptySerializable).super_Serializable._vptr_Serializable[1])
                    (this->payload,buffer + uVar3);
  return iVar2 + uVar3;
}

Assistant:

uint32 copyInto(uint8 * buffer) const
                {
                    uint32 o = 1; buffer[0] = header.typeAndFlags;
                    o += remLength.copyInto(buffer+o);
                    o += fixedVariableHeader.copyInto(buffer+o);
                    o += props.copyInto(buffer+o);
                    o += payload.copyInto(buffer+o);
                    return o;
                }